

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# types.cpp
# Opt level: O2

TypeRef __thiscall clickhouse::Type::CreateString(Type *this,size_t n)

{
  Type *this_00;
  __shared_count<(__gnu_cxx::_Lock_policy)2> extraout_RDX;
  TypeRef TVar1;
  
  this_00 = (Type *)operator_new(0x10);
  Type(this_00,FixedString);
  std::__shared_ptr<clickhouse::Type,(__gnu_cxx::_Lock_policy)2>::
  __shared_ptr<clickhouse::Type,void>
            ((__shared_ptr<clickhouse::Type,(__gnu_cxx::_Lock_policy)2> *)this,this_00);
  *(int *)(*(long *)this + 8) = (int)n;
  TVar1.super___shared_ptr<clickhouse::Type,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       extraout_RDX._M_pi;
  TVar1.super___shared_ptr<clickhouse::Type,_(__gnu_cxx::_Lock_policy)2>._M_ptr = this;
  return (TypeRef)TVar1.super___shared_ptr<clickhouse::Type,_(__gnu_cxx::_Lock_policy)2>;
}

Assistant:

TypeRef Type::CreateString(size_t n) {
    TypeRef type(new Type(Type::FixedString));
    type->string_size_ = n;
    return type;
}